

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlglInit(int width,int height)

{
  int i;
  GLint GVar1;
  long lVar2;
  uchar pixels [4];
  RenderBatch local_38;
  
  pixels[0] = 0xff;
  pixels[1] = 0xff;
  pixels[2] = 0xff;
  pixels[3] = 0xff;
  RLGL.State.defaultTextureId = rlLoadTexture(pixels,1,1,7,1);
  if (RLGL.State.defaultTextureId == 0) {
    TraceLog(4,"TEXTURE: Failed to load default texture");
  }
  else {
    TraceLog(3,"TEXTURE: [ID %i] Default texture loaded successfully",
             (ulong)RLGL.State.defaultTextureId);
  }
  RLGL.State.defaultShader.locs = (int *)calloc(0x20,4);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    RLGL.State.defaultShader.locs[lVar2] = -1;
  }
  RLGL.State.defaultVShaderId =
       rlCompileShader("#version 330                       \nin vec3 vertexPosition;            \nin vec2 vertexTexCoord;            \nin vec4 vertexColor;               \nout vec2 fragTexCoord;             \nout vec4 fragColor;                \nuniform mat4 mvp;                  \nvoid main()                        \n{                                  \n    fragTexCoord = vertexTexCoord; \n    fragColor = vertexColor;       \n    gl_Position = mvp*vec4(vertexPosition, 1.0); \n}                                  \n"
                       ,0x8b31);
  RLGL.State.defaultFShaderId =
       rlCompileShader("#version 330       \nin vec2 fragTexCoord;              \nin vec4 fragColor;                 \nout vec4 finalColor;               \nuniform sampler2D texture0;        \nuniform vec4 colDiffuse;           \nvoid main()                        \n{                                  \n    vec4 texelColor = texture(texture0, fragTexCoord);   \n    finalColor = texelColor*colDiffuse*fragColor;        \n}                                  \n"
                       ,0x8b30);
  RLGL.State.defaultShader.id =
       rlLoadShaderProgram(RLGL.State.defaultVShaderId,RLGL.State.defaultFShaderId);
  if (RLGL.State.defaultShader.id == 0) {
    TraceLog(4,"SHADER: [ID %i] Failed to load default shader",0);
  }
  else {
    TraceLog(3,"SHADER: [ID %i] Default shader loaded successfully",
             (ulong)RLGL.State.defaultShader.id);
    GVar1 = (*glad_glGetAttribLocation)(RLGL.State.defaultShader.id,"vertexPosition");
    *RLGL.State.defaultShader.locs = GVar1;
    GVar1 = (*glad_glGetAttribLocation)(RLGL.State.defaultShader.id,"vertexTexCoord");
    RLGL.State.defaultShader.locs[1] = GVar1;
    GVar1 = (*glad_glGetAttribLocation)(RLGL.State.defaultShader.id,"vertexColor");
    RLGL.State.defaultShader.locs[5] = GVar1;
    GVar1 = (*glad_glGetUniformLocation)(RLGL.State.defaultShader.id,"mvp");
    RLGL.State.defaultShader.locs[6] = GVar1;
    GVar1 = (*glad_glGetUniformLocation)(RLGL.State.defaultShader.id,"colDiffuse");
    RLGL.State.defaultShader.locs[0xc] = GVar1;
    GVar1 = (*glad_glGetUniformLocation)(RLGL.State.defaultShader.id,"texture0");
    RLGL.State.defaultShader.locs[0xf] = GVar1;
  }
  RLGL.State.currentShader._4_4_ = RLGL.State.defaultShader._4_4_;
  RLGL.State.currentShader.id = RLGL.State.defaultShader.id;
  RLGL.State.currentShader.locs = RLGL.State.defaultShader.locs;
  rlLoadRenderBatch(&local_38,1,0x2000);
  RLGL.defaultBatch.draws = local_38.draws;
  RLGL.defaultBatch.drawsCounter = local_38.drawsCounter;
  RLGL.defaultBatch.currentDepth = local_38.currentDepth;
  RLGL.defaultBatch.buffersCount = local_38.buffersCount;
  RLGL.defaultBatch.currentBuffer = local_38.currentBuffer;
  RLGL.defaultBatch.vertexBuffer = local_38.vertexBuffer;
  RLGL.currentBatch = &RLGL.defaultBatch;
  for (lVar2 = 0; lVar2 != 0x800; lVar2 = lVar2 + 0x40) {
    *(undefined4 *)((long)&RLGL.State.stack[0].m0 + lVar2) = 0x3f800000;
    *(undefined8 *)((long)&RLGL.State.stack[0].m4 + lVar2) = 0;
    *(undefined8 *)((long)&RLGL.State.stack[0].m12 + lVar2) = 0;
    *(undefined4 *)((long)&RLGL.State.stack[0].m5 + lVar2) = 0x3f800000;
    *(undefined8 *)((long)&RLGL.State.stack[0].m9 + lVar2) = 0;
    *(undefined8 *)((long)&RLGL.State.stack[0].m2 + lVar2) = 0;
    *(undefined4 *)((long)&RLGL.State.stack[0].m10 + lVar2) = 0x3f800000;
    *(undefined8 *)((long)&RLGL.State.stack[0].m14 + lVar2) = 0;
    *(undefined8 *)((long)&RLGL.State.stack[0].m7 + lVar2) = 0;
    *(undefined4 *)((long)&RLGL.State.stack[0].m15 + lVar2) = 0x3f800000;
  }
  RLGL.State.transform.m4 = 0.0;
  RLGL.State.transform.m8 = 0.0;
  RLGL.State.transform.m12 = 0.0;
  RLGL.State.transform.m1 = 0.0;
  RLGL.State.transform.m5 = 1.0;
  RLGL.State.transform.m9 = 0.0;
  RLGL.State.transform.m13 = 0.0;
  RLGL.State.transform.m2 = 0.0;
  RLGL.State.transform.m6 = 0.0;
  RLGL.State.transform.m10 = 1.0;
  RLGL.State.transform.m14 = 0.0;
  RLGL.State.transform.m3 = 0.0;
  RLGL.State.transform.m7 = 0.0;
  RLGL.State.transform.m11 = 0.0;
  RLGL.State.transform.m15 = 1.0;
  RLGL.State.projection.m4 = 0.0;
  RLGL.State.projection.m8 = 0.0;
  RLGL.State.projection.m12 = 0.0;
  RLGL.State.projection.m1 = 0.0;
  RLGL.State.projection.m5 = 1.0;
  RLGL.State.projection.m9 = 0.0;
  RLGL.State.projection.m13 = 0.0;
  RLGL.State.projection.m2 = 0.0;
  RLGL.State.projection.m6 = 0.0;
  RLGL.State.projection.m10 = 1.0;
  RLGL.State.projection.m14 = 0.0;
  RLGL.State.projection.m3 = 0.0;
  RLGL.State.projection.m7 = 0.0;
  RLGL.State.projection.m11 = 0.0;
  RLGL.State.projection.m15 = 1.0;
  RLGL.State.transform.m0 = 1.0;
  RLGL.State.modelview.m0 = 1.0;
  RLGL.State.modelview.m4 = 0.0;
  RLGL.State.modelview.m8 = 0.0;
  RLGL.State.modelview.m12 = 0.0;
  RLGL.State.modelview.m1 = 0.0;
  RLGL.State.modelview.m5 = 1.0;
  RLGL.State.modelview.m9 = 0.0;
  RLGL.State.modelview.m13 = 0.0;
  RLGL.State.modelview.m2 = 0.0;
  RLGL.State.modelview.m6 = 0.0;
  RLGL.State.modelview.m10 = 1.0;
  RLGL.State.modelview.m14 = 0.0;
  RLGL.State.modelview.m3 = 0.0;
  RLGL.State.modelview.m7 = 0.0;
  RLGL.State.modelview.m11 = 0.0;
  RLGL.State.modelview.m15 = 1.0;
  RLGL.State.projection.m0 = 1.0;
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  (*glad_glDepthFunc)(0x203);
  (*glad_glDisable)(0xb71);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glEnable)(0xbe2);
  (*glad_glCullFace)(0x405);
  (*glad_glFrontFace)(0x901);
  (*glad_glEnable)(0xb44);
  (*glad_glEnable)(0x884f);
  RLGL.State.framebufferWidth = width;
  RLGL.State.framebufferHeight = height;
  TraceLog(3,"RLGL: Default OpenGL state initialized successfully");
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClearDepth)(1.0);
  (*glad_glClear)(0x4100);
  return;
}

Assistant:

void rlglInit(int width, int height)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Init default white texture
    unsigned char pixels[4] = { 255, 255, 255, 255 };   // 1 pixel RGBA (4 bytes)
    RLGL.State.defaultTextureId = rlLoadTexture(pixels, 1, 1, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8, 1);

    if (RLGL.State.defaultTextureId != 0) TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Default texture loaded successfully", RLGL.State.defaultTextureId);
    else TRACELOG(LOG_WARNING, "TEXTURE: Failed to load default texture");

    // Init default Shader (customized for GL 3.3 and ES2)
    rlLoadShaderDefault(); // RLGL.State.defaultShader
    RLGL.State.currentShader = RLGL.State.defaultShader;

    // Init default vertex arrays buffers
    RLGL.defaultBatch = rlLoadRenderBatch(DEFAULT_BATCH_BUFFERS, DEFAULT_BATCH_BUFFER_ELEMENTS);
    RLGL.currentBatch = &RLGL.defaultBatch;

    // Init stack matrices (emulating OpenGL 1.1)
    for (int i = 0; i < MAX_MATRIX_STACK_SIZE; i++) RLGL.State.stack[i] = MatrixIdentity();

    // Init internal matrices
    RLGL.State.transform = MatrixIdentity();
    RLGL.State.projection = MatrixIdentity();
    RLGL.State.modelview = MatrixIdentity();
    RLGL.State.currentMatrix = &RLGL.State.modelview;
#endif  // GRAPHICS_API_OPENGL_33 || GRAPHICS_API_OPENGL_ES2

    // Initialize OpenGL default states
    //----------------------------------------------------------
    // Init state: Depth test
    glDepthFunc(GL_LEQUAL);                                 // Type of depth testing to apply
    glDisable(GL_DEPTH_TEST);                               // Disable depth testing for 2D (only used for 3D)

    // Init state: Blending mode
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);      // Color blending function (how colors are mixed)
    glEnable(GL_BLEND);                                     // Enable color blending (required to work with transparencies)

    // Init state: Culling
    // NOTE: All shapes/models triangles are drawn CCW
    glCullFace(GL_BACK);                                    // Cull the back face (default)
    glFrontFace(GL_CCW);                                    // Front face are defined counter clockwise (default)
    glEnable(GL_CULL_FACE);                                 // Enable backface culling

    // Init state: Cubemap seamless
#if defined(GRAPHICS_API_OPENGL_33)
    glEnable(GL_TEXTURE_CUBE_MAP_SEAMLESS);                 // Seamless cubemaps (not supported on OpenGL ES 2.0)
#endif

#if defined(GRAPHICS_API_OPENGL_11)
    // Init state: Color hints (deprecated in OpenGL 3.0+)
    glHint(GL_PERSPECTIVE_CORRECTION_HINT, GL_NICEST);      // Improve quality of color and texture coordinate interpolation
    glShadeModel(GL_SMOOTH);                                // Smooth shading between vertex (vertex colors interpolation)
#endif

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Store screen size into global variables
    RLGL.State.framebufferWidth = width;
    RLGL.State.framebufferHeight = height;

    TRACELOG(LOG_INFO, "RLGL: Default OpenGL state initialized successfully");
    //----------------------------------------------------------
#endif

    // Init state: Color/Depth buffers clear
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);                   // Set clear color (black)
    glClearDepth(1.0f);                                     // Set clear depth value (default)
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);     // Clear color and depth buffers (depth buffer required for 3D)
}